

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackstring.hpp
# Opt level: O0

void __thiscall
StackString<32UL,_char16_t>::ReallocateBuffer(StackString<32UL,_char16_t> *this,SIZE_T count)

{
  char16_t *pcVar1;
  char16_t *newBuffer;
  SIZE_T count_local;
  StackString<32UL,_char16_t> *this_local;
  
  pcVar1 = (char16_t *)PAL_malloc((count + 1) * 2);
  if (pcVar1 == (char16_t *)0x0) {
    SetLastError(8);
    DeleteBuffer(this);
    this->m_count = 0;
  }
  else {
    DeleteBuffer(this);
    this->m_buffer = pcVar1;
    this->m_count = count;
    this->m_size = count + 1;
  }
  return;
}

Assistant:

void ReallocateBuffer(SIZE_T count)
    {
        // count is always > STACKCOUNT here.
        T * newBuffer = (T *)PAL_malloc((count + 1) * sizeof(T));
        if (NULL == newBuffer)
        {
            SetLastError(ERROR_NOT_ENOUGH_MEMORY);

            DeleteBuffer();
            m_count = 0;

            return;
        }

        DeleteBuffer();
        m_buffer = newBuffer;
        m_count = count;
        m_size = count+1;

        return;
    }